

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

CURLcode setup_range(Curl_easy *data)

{
  char *pcVar1;
  UrlState *s;
  Curl_easy *data_local;
  
  (data->state).resume_from = (data->set).set_resume_from;
  if (((data->state).resume_from == 0) && ((data->set).str[0x17] == (char *)0x0)) {
    *(uint *)&(data->state).field_0x6d0 = *(uint *)&(data->state).field_0x6d0 & 0xfffffdff;
  }
  else {
    if ((*(uint *)&(data->state).field_0x6d0 >> 10 & 1) != 0) {
      (*Curl_cfree)((data->state).range);
    }
    if ((data->state).resume_from == 0) {
      pcVar1 = (*Curl_cstrdup)((data->set).str[0x17]);
      (data->state).range = pcVar1;
    }
    else {
      pcVar1 = curl_maprintf("%ld-",(data->state).resume_from);
      (data->state).range = pcVar1;
    }
    *(uint *)&(data->state).field_0x6d0 =
         *(uint *)&(data->state).field_0x6d0 & 0xfffffbff |
         (uint)((data->state).range != (char *)0x0) << 10;
    if ((data->state).range == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    *(uint *)&(data->state).field_0x6d0 = *(uint *)&(data->state).field_0x6d0 & 0xfffffdff | 0x200;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode setup_range(struct Curl_easy *data)
{
  struct UrlState *s = &data->state;
  s->resume_from = data->set.set_resume_from;
  if(s->resume_from || data->set.str[STRING_SET_RANGE]) {
    if(s->rangestringalloc)
      free(s->range);

    if(s->resume_from)
      s->range = aprintf("%" CURL_FORMAT_CURL_OFF_T "-", s->resume_from);
    else
      s->range = strdup(data->set.str[STRING_SET_RANGE]);

    s->rangestringalloc = (s->range) ? TRUE : FALSE;

    if(!s->range)
      return CURLE_OUT_OF_MEMORY;

    /* tell ourselves to fetch this range */
    s->use_range = TRUE;        /* enable range download */
  }
  else
    s->use_range = FALSE; /* disable range download */

  return CURLE_OK;
}